

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void setMemSize(void)

{
  char *pcVar1;
  ostream *poVar2;
  int size;
  int local_c;
  
  local_c = 0x800;
  pcVar1 = strtok((char *)0x0,"");
  if (pcVar1 != (char *)0x0) {
    __isoc99_sscanf(pcVar1,"%d",&local_c);
    reset(local_c);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "mem size changed. all of mem and process info have been reset.");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"have no enough args");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void setMemSize() {
    // 获取参数
    char *p;
    int size = DEFAULT_MEM_SIZE;
    p = strtok(NULL, "");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    sscanf(p, "%d", &size);

    // 重置
    reset(size);

    cout << "mem size changed. all of mem and process info have been reset." << endl;
}